

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

BOOL SetThreadContext(HANDLE hThread,CONTEXT *lpContext)

{
  PAL_ERROR PVar1;
  DWORD dwProcessId;
  BOOL BVar2;
  CPalThread *pThread;
  PAL_ERROR *pPVar3;
  int *piVar4;
  CPalThread *local_38;
  CPalThread *pTargetThread;
  IPalObject *pobjThread;
  
  pTargetThread = (CPalThread *)0x0;
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    BVar2 = 0;
    PVar1 = CorUnix::InternalGetThreadDataFromHandle
                      (pThread,hThread,0,&local_38,(IPalObject **)&pTargetThread);
    if (PVar1 == 0) {
      if (local_38->m_fIsDummy == false) {
        dwProcessId = GetCurrentProcessId();
        BVar2 = CONTEXT_SetThreadContext(dwProcessId,local_38->m_pthreadSelf,lpContext);
      }
      else {
        BVar2 = 0;
        fprintf(_stderr,"] %s %s:%d","SetThreadContext",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/debug/debug.cpp"
                ,0x21b);
        fprintf(_stderr,"Dummy thread handle passed to SetThreadContext\n");
        piVar4 = __errno_location();
        *piVar4 = 6;
      }
    }
    else {
      pPVar3 = (PAL_ERROR *)__errno_location();
      *pPVar3 = PVar1;
    }
    if (pTargetThread != (CPalThread *)0x0) {
      (*pTargetThread->_vptr_CPalThread[8])(pTargetThread,pThread);
    }
    return BVar2;
  }
  abort();
}

Assistant:

BOOL
PALAPI
SetThreadContext(
           IN HANDLE hThread,
           IN CONST CONTEXT *lpContext)
{
    PAL_ERROR palError;
    CPalThread *pThread;
    CPalThread *pTargetThread;
    IPalObject *pobjThread = NULL;
    BOOL ret = FALSE;

    PERF_ENTRY(SetThreadContext);
    ENTRY("SetThreadContext (hThread=%p, lpContext=%p)\n",hThread,lpContext);

    pThread = InternalGetCurrentThread();

    palError = InternalGetThreadDataFromHandle(
        pThread,
        hThread,
        0, // THREAD_SET_CONTEXT
        &pTargetThread,
        &pobjThread
        );

    if (NO_ERROR == palError)
    {
        if (!pTargetThread->IsDummy())
        {
            ret = CONTEXT_SetThreadContext(
                GetCurrentProcessId(),
                pTargetThread->GetPThreadSelf(),
                lpContext
                );
        }
        else
        {
            ASSERT("Dummy thread handle passed to SetThreadContext\n");
            pThread->SetLastError(ERROR_INVALID_HANDLE);
        }
    }
    else
    {
        pThread->SetLastError(palError);
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    return ret;
}